

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

void __thiscall
duckdb::Relation::Insert(Relation *this,vector<duckdb::vector<duckdb::Value,_true>,_true> *values)

{
  ValueRelation *this_00;
  shared_ptr<duckdb::ValueRelation,_true> rel;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  string sStack_58;
  shared_ptr<duckdb::ClientContext,_true> local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->(&this->context);
  ClientContextWrapper::GetContext((ClientContextWrapper *)&sStack_58);
  make_shared_ptr<duckdb::ValueRelation,duckdb::shared_ptr<duckdb::ClientContext,true>,duckdb::vector<duckdb::vector<duckdb::Value,true>,true>const&,duckdb::vector<std::__cxx11::string,true>,char_const(&)[7]>
            (&local_38,(vector<duckdb::vector<duckdb::Value,_true>,_true> *)&sStack_58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)values,(char (*) [7])&local_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_58._M_string_length);
  this_00 = shared_ptr<duckdb::ValueRelation,_true>::operator->
                      ((shared_ptr<duckdb::ValueRelation,_true> *)&local_38);
  (*this->_vptr_Relation[5])(&sStack_58,this);
  Insert(&this_00->super_Relation,&sStack_58);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.internal.
              super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_28);
  return;
}

Assistant:

void Relation::Insert(const vector<vector<Value>> &values) {
	vector<string> column_names;
	auto rel = make_shared_ptr<ValueRelation>(context->GetContext(), values, std::move(column_names), "values");
	rel->Insert(GetAlias());
}